

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

int cs_op_count(csh ud,cs_insn *insn,uint op_type)

{
  byte bVar1;
  cs_detail *pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (ud == 0) {
    return -1;
  }
  if (*(int *)(ud + 0x60) != 0) {
    if (insn->id == 0) {
      *(undefined4 *)(ud + 0x50) = 0xb;
      return -1;
    }
    pcVar2 = insn->detail;
    if (pcVar2 != (cs_detail *)0x0) {
      *(undefined4 *)(ud + 0x50) = 0;
      switch(*(undefined4 *)ud) {
      case 0:
        goto switchD_001d1c9a_caseD_0;
      case 1:
        uVar4 = (ulong)(pcVar2->field_6).x86.opcode[2];
        if (uVar4 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x2d) == op_type);
          lVar5 = lVar5 + 0x38;
        } while (uVar4 * 0x38 - lVar5 != 0);
        return iVar3;
      case 2:
        bVar1 = (pcVar2->field_6).x86.prefix[0];
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x15) == op_type);
          lVar5 = lVar5 + 0x18;
        } while ((ulong)bVar1 * 0x18 != lVar5);
        return iVar3;
      case 3:
        bVar1 = (pcVar2->field_6).x86.op_count;
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x55) == op_type);
          lVar5 = lVar5 + 0x30;
        } while ((ulong)bVar1 * 0x30 != lVar5);
        return iVar3;
      case 4:
        bVar1 = (pcVar2->field_6).x86.addr_size;
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x1d) == op_type);
          lVar5 = lVar5 + 0x18;
        } while ((ulong)bVar1 * 0x18 != lVar5);
        return iVar3;
      case 5:
        bVar1 = (pcVar2->field_6).x86.rex;
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x1d) == op_type);
          lVar5 = lVar5 + 0x10;
        } while ((ulong)bVar1 * 0x10 != lVar5);
        return iVar3;
      case 6:
        bVar1 = (pcVar2->field_6).x86.opcode[0];
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x15) == op_type);
          lVar5 = lVar5 + 0x20;
        } while ((ulong)bVar1 * 0x20 != lVar5);
        return iVar3;
      case 7:
        bVar1 = (pcVar2->field_6).x86.prefix[0];
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x11) == op_type);
          lVar5 = lVar5 + 0x10;
        } while ((ulong)bVar1 * 0x10 != lVar5);
        return iVar3;
      case 8:
        uVar4 = (ulong)(pcVar2->field_6).m68k.op_count;
        if (uVar4 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x3d) == op_type);
          lVar5 = lVar5 + 0x38;
        } while (uVar4 * 0x38 - lVar5 != 0);
        return iVar3;
      case 9:
        bVar1 = (pcVar2->field_6).x86.prefix[0];
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x11) == op_type);
          lVar5 = lVar5 + 0x20;
        } while ((ulong)bVar1 * 0x20 != lVar5);
        return iVar3;
      case 10:
        bVar1 = (pcVar2->field_6).x86.prefix[1];
        if (bVar1 == 0) {
          return 0;
        }
        lVar5 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x11) == op_type);
          lVar5 = lVar5 + 0x18;
        } while ((ulong)bVar1 * 0x18 != lVar5);
        return iVar3;
      case 0xb:
        return 0;
      case 0xc:
        uVar4 = (ulong)(pcVar2->field_6).x86.opcode[1];
        if (uVar4 == 0) {
          return 0;
        }
        uVar6 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + uVar6 * 8 + 0x15) == op_type);
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        return iVar3;
      default:
        *(undefined4 *)(ud + 0x50) = 3;
        return -1;
      }
    }
  }
  *(undefined4 *)(ud + 0x50) = 7;
  return -1;
switchD_001d1c9a_caseD_0:
  bVar1 = (pcVar2->field_6).arm.op_count;
  if (bVar1 == 0) {
    return 0;
  }
  lVar5 = 0;
  iVar3 = 0;
  do {
    iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar5 + 0x41) == op_type);
    lVar5 = lVar5 + 0x30;
  } while ((ulong)bVar1 * 0x30 != lVar5);
  return iVar3;
}

Assistant:

CAPSTONE_API cs_op_count(csh ud, const cs_insn *insn, unsigned int op_type)
{
	struct cs_struct *handle;
	unsigned int count = 0, i;
	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return -1;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	handle->errnum = CS_ERR_OK;

	switch (handle->arch) {
		default:
			handle->errnum = CS_ERR_HANDLE;
			return -1;
		case CS_ARCH_ARM:
			for (i = 0; i < insn->detail->arm.op_count; i++)
				if (insn->detail->arm.operands[i].type == (arm_op_type)op_type)
					count++;
			break;
		case CS_ARCH_ARM64:
			for (i = 0; i < insn->detail->arm64.op_count; i++)
				if (insn->detail->arm64.operands[i].type == (arm64_op_type)op_type)
					count++;
			break;
		case CS_ARCH_X86:
			for (i = 0; i < insn->detail->x86.op_count; i++)
				if (insn->detail->x86.operands[i].type == (x86_op_type)op_type)
					count++;
			break;
		case CS_ARCH_MIPS:
			for (i = 0; i < insn->detail->mips.op_count; i++)
				if (insn->detail->mips.operands[i].type == (mips_op_type)op_type)
					count++;
			break;
		case CS_ARCH_PPC:
			for (i = 0; i < insn->detail->ppc.op_count; i++)
				if (insn->detail->ppc.operands[i].type == (ppc_op_type)op_type)
					count++;
			break;
		case CS_ARCH_SPARC:
			for (i = 0; i < insn->detail->sparc.op_count; i++)
				if (insn->detail->sparc.operands[i].type == (sparc_op_type)op_type)
					count++;
			break;
		case CS_ARCH_SYSZ:
			for (i = 0; i < insn->detail->sysz.op_count; i++)
				if (insn->detail->sysz.operands[i].type == (sysz_op_type)op_type)
					count++;
			break;
		case CS_ARCH_XCORE:
			for (i = 0; i < insn->detail->xcore.op_count; i++)
				if (insn->detail->xcore.operands[i].type == (xcore_op_type)op_type)
					count++;
			break;
		case CS_ARCH_M68K:
			for (i = 0; i < insn->detail->m68k.op_count; i++)
				if (insn->detail->m68k.operands[i].type == (m68k_op_type)op_type)
					count++;
			break;
		case CS_ARCH_TMS320C64X:
			for (i = 0; i < insn->detail->tms320c64x.op_count; i++)
				if (insn->detail->tms320c64x.operands[i].type == (tms320c64x_op_type)op_type)
					count++;
			break;
		case CS_ARCH_M680X:
			for (i = 0; i < insn->detail->m680x.op_count; i++)
				if (insn->detail->m680x.operands[i].type == (m680x_op_type)op_type)
					count++;
			break;
		case CS_ARCH_EVM:
#if 0
			for (i = 0; i < insn->detail->evm.op_count; i++)
				if (insn->detail->evm.operands[i].type == (evm_op_type)op_type)
					count++;
#endif
			break;
		case CS_ARCH_MOS65XX:
			for (i = 0; i < insn->detail->mos65xx.op_count; i++)
				if (insn->detail->mos65xx.operands[i].type == (mos65xx_op_type)op_type)
					count++;
			break;
	}

	return count;
}